

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::SerializeMapKeyWithCachedSizes
                  (FieldDescriptor *field,MapKey *value,uint8 *target,EpsCopyOutputStream *stream)

{
  Type TVar1;
  uint32 uVar2;
  int32 iVar3;
  uint32 uVar4;
  int iVar5;
  int64 n;
  uint8 *puVar6;
  uint64 uVar7;
  size_t __n;
  void *__src;
  string *in_RCX;
  uint8 *in_RDX;
  MapKey *in_RSI;
  ptrdiff_t size;
  LogMessage *in_stack_fffffffffffffc28;
  EpsCopyOutputStream *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffc40;
  string *psVar8;
  undefined7 in_stack_fffffffffffffc48;
  bool bVar9;
  uint8 *local_348;
  uint8 *local_2c8;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  io::EpsCopyOutputStream::EnsureSpace
            (in_stack_fffffffffffffc30,(uint8 **)in_stack_fffffffffffffc28);
  TVar1 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffc40);
  local_348 = in_RDX;
  switch(TVar1) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              (in_stack_fffffffffffffc40,level,(char *)in_stack_fffffffffffffc30,
               (int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
    LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    LogMessage::~LogMessage((LogMessage *)0x47a8c3);
    break;
  case TYPE_INT64:
    uVar7 = MapKey::GetInt64Value(in_RSI);
    uVar4 = WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,in_RDX);
    local_348 = io::CodedOutputStream::WriteVarint64ToArray(uVar7,puVar6);
    break;
  case TYPE_UINT64:
    uVar7 = MapKey::GetUInt64Value(in_RSI);
    uVar4 = WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,in_RDX);
    local_348 = io::CodedOutputStream::WriteVarint64ToArray(uVar7,puVar6);
    break;
  case TYPE_INT32:
    MapKey::GetInt32Value(in_RSI);
    iVar3 = (int32)((ulong)in_stack_fffffffffffffc30 >> 0x20);
    uVar4 = WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar4,in_RDX);
    local_348 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          (iVar3,(uint8 *)in_stack_fffffffffffffc28);
    break;
  case TYPE_FIXED64:
    uVar7 = MapKey::GetUInt64Value(in_RSI);
    uVar4 = WireFormatLite::MakeTag(1,WIRETYPE_FIXED64);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,in_RDX);
    local_348 = io::CodedOutputStream::WriteLittleEndian64ToArray(uVar7,puVar6);
    break;
  case TYPE_FIXED32:
    uVar4 = MapKey::GetUInt32Value(in_RSI);
    uVar2 = WireFormatLite::MakeTag(1,WIRETYPE_FIXED32);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,in_RDX);
    local_348 = io::CodedOutputStream::WriteLittleEndian32ToArray(uVar4,puVar6);
    break;
  case TYPE_BOOL:
    bVar9 = MapKey::GetBoolValue(in_RSI);
    uVar4 = WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,in_RDX);
    local_348 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar9,puVar6);
    break;
  case TYPE_STRING:
    MapKey::GetStringValue_abi_cxx11_(in_RSI);
    psVar8 = in_RCX;
    __n = std::__cxx11::string::size();
    bVar9 = true;
    if ((long)__n < 0x80) {
      in_stack_fffffffffffffc30 = (EpsCopyOutputStream *)((*(long *)psVar8 - (long)in_RDX) + 0x10);
      iVar5 = io::EpsCopyOutputStream::TagSize(8);
      bVar9 = (long)in_stack_fffffffffffffc30 + (-1 - (long)iVar5) < (long)__n;
    }
    if (bVar9 == false) {
      *in_RDX = '\n';
      in_RDX[1] = (uint8)__n;
      puVar6 = in_RDX + 2;
      __src = (void *)std::__cxx11::string::data();
      memcpy(puVar6,__src,__n);
      local_2c8 = in_RDX + 2 + __n;
    }
    else {
      local_2c8 = io::EpsCopyOutputStream::WriteStringOutline
                            ((EpsCopyOutputStream *)CONCAT17(bVar9,in_stack_fffffffffffffc48),
                             (uint32)((ulong)psVar8 >> 0x20),in_RCX,
                             (uint8 *)in_stack_fffffffffffffc30);
    }
    local_348 = local_2c8;
    break;
  case TYPE_UINT32:
    uVar4 = MapKey::GetUInt32Value(in_RSI);
    uVar2 = WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,in_RDX);
    local_348 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,puVar6);
    break;
  case TYPE_SFIXED32:
    uVar4 = MapKey::GetInt32Value(in_RSI);
    uVar2 = WireFormatLite::MakeTag(1,WIRETYPE_FIXED32);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,in_RDX);
    local_348 = io::CodedOutputStream::WriteLittleEndian32ToArray(uVar4,puVar6);
    break;
  case TYPE_SFIXED64:
    uVar7 = MapKey::GetInt64Value(in_RSI);
    uVar4 = WireFormatLite::MakeTag(1,WIRETYPE_FIXED64);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,in_RDX);
    local_348 = io::CodedOutputStream::WriteLittleEndian64ToArray(uVar7,puVar6);
    break;
  case TYPE_SINT32:
    iVar3 = MapKey::GetInt32Value(in_RSI);
    uVar4 = WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,in_RDX);
    uVar4 = WireFormatLite::ZigZagEncode32(iVar3);
    local_348 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,puVar6);
    break;
  case MAX_TYPE:
    n = MapKey::GetInt64Value(in_RSI);
    uVar4 = WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,in_RDX);
    uVar7 = WireFormatLite::ZigZagEncode64(n);
    local_348 = io::CodedOutputStream::WriteVarint64ToArray(uVar7,puVar6);
  }
  return local_348;
}

Assistant:

static uint8* SerializeMapKeyWithCachedSizes(const FieldDescriptor* field,
                                             const MapKey& value, uint8* target,
                                             io::EpsCopyOutputStream* stream) {
  stream->EnsureSpace(&target);
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      break;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType)   \
  case FieldDescriptor::TYPE_##FieldType:                    \
    target = WireFormatLite::Write##CamelFieldType##ToArray( \
        1, value.Get##CamelCppType##Value(), target);        \
    break;
      CASE_TYPE(INT64, Int64, Int64)
      CASE_TYPE(UINT64, UInt64, UInt64)
      CASE_TYPE(INT32, Int32, Int32)
      CASE_TYPE(FIXED64, Fixed64, UInt64)
      CASE_TYPE(FIXED32, Fixed32, UInt32)
      CASE_TYPE(BOOL, Bool, Bool)
      CASE_TYPE(UINT32, UInt32, UInt32)
      CASE_TYPE(SFIXED32, SFixed32, Int32)
      CASE_TYPE(SFIXED64, SFixed64, Int64)
      CASE_TYPE(SINT32, SInt32, Int32)
      CASE_TYPE(SINT64, SInt64, Int64)
#undef CASE_TYPE
    case FieldDescriptor::TYPE_STRING:
      target = stream->WriteString(1, value.GetStringValue(), target);
      break;
  }
  return target;
}